

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.h
# Opt level: O2

void __thiscall cmQtAutoGenInitializer::GenVarsT::GenVarsT(GenVarsT *this,GenT gen)

{
  string *psVar1;
  
  this->Enabled = false;
  this->Gen = gen;
  psVar1 = cmQtAutoGen::GeneratorNameUpper_abi_cxx11_(gen);
  this->GenNameUpper = psVar1;
  (this->ExecutableTargetName)._M_dataplus._M_p = (pointer)&(this->ExecutableTargetName).field_2;
  (this->ExecutableTargetName)._M_string_length = 0;
  (this->ExecutableTargetName).field_2._M_local_buf[0] = '\0';
  this->ExecutableTarget = (cmGeneratorTarget *)0x0;
  (this->Executable)._M_dataplus._M_p = (pointer)&(this->Executable).field_2;
  (this->Executable)._M_string_length = 0;
  (this->Executable).field_2._M_local_buf[0] = '\0';
  (this->ExecutableFeatures).
  super___shared_ptr<cmQtAutoGen::CompilerFeatures,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->ExecutableFeatures).
  super___shared_ptr<cmQtAutoGen::CompilerFeatures,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  return;
}

Assistant:

GenVarsT(GenT gen)
      : Gen(gen)
      , GenNameUpper(cmQtAutoGen::GeneratorNameUpper(gen)){}